

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void __thiscall
Eigen::internal::
gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_1,_false,_0>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
::operator()(gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_1,_false,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
             *this,long row,long rows,long col,long cols,GemmParallelInfo<long> *info)

{
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  non_const_type pMVar2;
  long resStride;
  
  if (cols == -1) {
    cols = (this->m_rhs->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
           .m_storage.m_rows;
  }
  pMVar1 = this->m_lhs;
  pMVar2 = this->m_rhs->m_matrix;
  resStride = (this->m_dest->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
  general_matrix_matrix_product<long,_double,_0,_false,_double,_1,_false,_0>::run
            (rows,cols,
             (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols,(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data + row,
             (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows,(pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                    m_storage.m_data + col,
             (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows,(this->m_dest->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
                    .m_storage.m_data + col * resStride + row,resStride,this->m_actualAlpha,
             &this->m_blocking->super_level3_blocking<double,_double>,info);
  return;
}

Assistant:

void operator() (Index row, Index rows, Index col=0, Index cols=-1, GemmParallelInfo<Index>* info=0) const
  {
    if(cols==-1)
      cols = m_rhs.cols();

    Gemm::run(rows, cols, m_lhs.cols(),
              &m_lhs.coeffRef(row,0), m_lhs.outerStride(),
              &m_rhs.coeffRef(0,col), m_rhs.outerStride(),
              (Scalar*)&(m_dest.coeffRef(row,col)), m_dest.outerStride(),
              m_actualAlpha, m_blocking, info);
  }